

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::SMFixIt,_4U>::~SmallVector(SmallVector<llvm::SMFixIt,_4U> *this)

{
  iterator S;
  iterator E;
  SmallVector<llvm::SMFixIt,_4U> *this_local;
  
  S = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::begin
                ((SmallVectorTemplateCommon<llvm::SMFixIt,_void> *)this);
  E = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::end
                ((SmallVectorTemplateCommon<llvm::SMFixIt,_void> *)this);
  SmallVectorTemplateBase<llvm::SMFixIt,_false>::destroy_range(S,E);
  SmallVectorImpl<llvm::SMFixIt>::~SmallVectorImpl(&this->super_SmallVectorImpl<llvm::SMFixIt>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }